

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::SubjectSetRegisterTest_test_RFS_subject_is_configured_right_Test::
TestBody(SubjectSetRegisterTest_test_RFS_subject_is_configured_right_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_88;
  Message local_80 [3];
  allocator<char> local_61;
  string local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  SubjectSetRegisterTest_test_RFS_subject_is_configured_right_Test *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_60,"RequestFor",&local_61);
  bidfx_public_api::price::subject::Subject::GetComponent(&local_40,SS_RFS_SUBJECT1,local_60);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_20,"\"Stream\"","SS_RFS_SUBJECT1.GetComponent(\"RequestFor\")"
             ,(char (*) [7])0x330cc6,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_80);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x26b,message);
    testing::internal::AssertHelper::operator=(&local_88,local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, test_RFS_subject_is_configured_right)
{
    EXPECT_EQ("Stream", SS_RFS_SUBJECT1.GetComponent("RequestFor"));
}